

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O3

Result SCoro::Impl::
       poll_fn<1ul,SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>>
                 (SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>
                  *self)

{
  Result RVar1;
  ulong uVar2;
  
  RVar1 = (*GetImpl<SCoro::SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>,_std::integer_sequence<unsigned_long,_0UL,_1UL>_>
            ::lut[((EboIndex<2UL> *)
                  ((long)&(self->super_type).
                          super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
                          .
                          super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
                          .
                          super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
                          .
                          super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
                          .
                          super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
                          .
                          super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
                  + 0x10))->index])
                    ((SCoro<Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::RecordTime,_Delay<100U>::type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintStart>_>::WaitForExpiry>
                      *)((long)&(self->super_type).
                                super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
                                .
                                super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
                                .
                                super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
                                .
                                super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
                                .
                                super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
                                .
                                super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
                        + 8));
  if (RVar1.value != Yield) {
    if (RVar1.value == Next) {
      uVar2 = ((EboIndex<2UL> *)
              ((long)&(self->super_type).
                      super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
                      .
                      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
                      .
                      super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
                      .
                      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
                      .
                      super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
                      .
                      super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
              + 0x10))->index + 1;
      ((EboIndex<2UL> *)
      ((long)&(self->super_type).
              super_PrintTag<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
              .
              super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
              .
              super_type<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>_>
              .
              super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_PrintPollAttempts,_Delay<100U>::type,_PrintStart>
              .
              super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>_>
              .
              super_StagesImpl<SCoro::SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>,_5UL,_Delay<100U>::type,_PrintStart>
      + 0x10))->index = uVar2;
      RVar1.value = (uint)(uVar2 < 2) * 2;
    }
    else {
      RVar1.value = End;
    }
  }
  return (Result)RVar1.value;
}

Assistant:

constexpr static Result poll_fn(Stgs & self) noexcept
        {
            return self.get_at(Index<index>{}).Poll();
        }